

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void LargeIntRegMultiply<long,_unsigned_long>::
     RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (int64_t *a,uint64_t *b,int64_t *pRet)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  uint64_t uVar6;
  ulong uVar7;
  
  uVar7 = *a;
  if ((long)uVar7 < 0) {
    uVar6 = AbsValueHelper<long,_1>::Abs(uVar7);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *b;
    uVar7 = SUB168(auVar2 * auVar4,0);
    if ((SUB168(auVar2 * auVar4,8) == 0) && (uVar7 < 0x8000000000000001)) {
      lVar5 = -uVar7;
      goto LAB_00142e7b;
    }
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *b;
    lVar5 = SUB168(auVar1 * auVar3,0);
    if ((SUB168(auVar1 * auVar3,8) == 0) && (-1 < lVar5)) {
LAB_00142e7b:
      *pRet = lVar5;
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void RegMultiplyThrow( const std::int64_t& a, const std::uint64_t& b, std::int64_t* pRet ) SAFEINT_CPP_THROW
    {
        bool aNegative = false;
        std::uint64_t tmp = 0;
        std::int64_t a1 = a;

        if( a1 < 0 )
        {
            aNegative = true;
            a1 = (std::int64_t)AbsValueHelper< std::int64_t, GetAbsMethod< std::int64_t >::method >::Abs(a1);
        }

        if( LargeIntRegMultiply< std::uint64_t, std::uint64_t >::RegMultiply( (std::uint64_t)a1, (std::uint64_t)b, &tmp ) )
        {
            // The unsigned multiplication didn't overflow
            if( aNegative )
            {
                // Result must be negative
                if( tmp <= (std::uint64_t)std::numeric_limits< std::int64_t >::min() )
                {
                    *pRet = SignedNegation< std::int64_t >::Value( tmp );
                    return;
                }
            }
            else
            {
                // Result must be positive
                if( tmp <= (std::uint64_t)std::numeric_limits<std::int64_t>::max() )
                {
                    *pRet = (std::int64_t)tmp;
                    return;
                }
            }
        }

        E::SafeIntOnOverflow();
    }